

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O1

ON_Locale *
ON_Locale::FromWindowsLCIDAndName
          (ON_Locale *__return_storage_ptr__,ON__UINT32 windows_lcid,char *name)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  int line_number;
  ON_Locale *__src;
  ON_Locale local_c8;
  
  if (windows_lcid == 0x27) {
LAB_004d353d:
    __src = &InvariantCulture;
  }
  else {
    if (windows_lcid != 0) {
      if ((name == (char *)0x0) || (*name == '\0')) goto LAB_004d353d;
      ON_Locale(&local_c8);
      local_c8.m_windows_lcid = windows_lcid;
      bVar2 = ParseName(name,-1,local_c8.m_language_subtag,9,(char *)0x0,0,local_c8.m_script_subtag,
                        5,local_c8.m_region_subtag,5,local_c8.m_windows_sortorder,7);
      if (bVar2) {
        if (local_c8.m_language_subtag[0] == '\0') {
          pcVar4 = "ParseLocaleName() returned empty language name.";
          line_number = 0x39f;
        }
        else if (local_c8.m_language_subtag[1] == '\0') {
          pcVar4 = "ParseLocaleName() returned invalid language name.";
          line_number = 0x3a5;
        }
        else {
          local_c8.m_bcp47_language_tag[0x40] = '\0';
          local_c8.m_bcp47_language_tag[0x41] = '\0';
          local_c8.m_bcp47_language_tag[0x42] = '\0';
          local_c8.m_bcp47_language_tag[0x43] = '\0';
          local_c8.m_bcp47_language_tag[0x44] = '\0';
          local_c8.m_bcp47_language_tag[0x45] = '\0';
          local_c8.m_bcp47_language_tag[0x46] = '\0';
          local_c8.m_bcp47_language_tag[0x47] = '\0';
          local_c8.m_bcp47_language_tag[0x48] = '\0';
          local_c8.m_bcp47_language_tag[0x49] = '\0';
          local_c8.m_bcp47_language_tag[0x4a] = '\0';
          local_c8.m_bcp47_language_tag[0x4b] = '\0';
          local_c8.m_bcp47_language_tag[0x4c] = '\0';
          local_c8.m_bcp47_language_tag[0x30] = '\0';
          local_c8.m_bcp47_language_tag[0x31] = '\0';
          local_c8.m_bcp47_language_tag[0x32] = '\0';
          local_c8.m_bcp47_language_tag[0x33] = '\0';
          local_c8.m_bcp47_language_tag[0x34] = '\0';
          local_c8.m_bcp47_language_tag[0x35] = '\0';
          local_c8.m_bcp47_language_tag[0x36] = '\0';
          local_c8.m_bcp47_language_tag[0x37] = '\0';
          local_c8.m_bcp47_language_tag[0x38] = '\0';
          local_c8.m_bcp47_language_tag[0x39] = '\0';
          local_c8.m_bcp47_language_tag[0x3a] = '\0';
          local_c8.m_bcp47_language_tag[0x3b] = '\0';
          local_c8.m_bcp47_language_tag[0x3c] = '\0';
          local_c8.m_bcp47_language_tag[0x3d] = '\0';
          local_c8.m_bcp47_language_tag[0x3e] = '\0';
          local_c8.m_bcp47_language_tag[0x3f] = '\0';
          local_c8.m_bcp47_language_tag[0x20] = '\0';
          local_c8.m_bcp47_language_tag[0x21] = '\0';
          local_c8.m_bcp47_language_tag[0x22] = '\0';
          local_c8.m_bcp47_language_tag[0x23] = '\0';
          local_c8.m_bcp47_language_tag[0x24] = '\0';
          local_c8.m_bcp47_language_tag[0x25] = '\0';
          local_c8.m_bcp47_language_tag[0x26] = '\0';
          local_c8.m_bcp47_language_tag[0x27] = '\0';
          local_c8.m_bcp47_language_tag[0x28] = '\0';
          local_c8.m_bcp47_language_tag[0x29] = '\0';
          local_c8.m_bcp47_language_tag[0x2a] = '\0';
          local_c8.m_bcp47_language_tag[0x2b] = '\0';
          local_c8.m_bcp47_language_tag[0x2c] = '\0';
          local_c8.m_bcp47_language_tag[0x2d] = '\0';
          local_c8.m_bcp47_language_tag[0x2e] = '\0';
          local_c8.m_bcp47_language_tag[0x2f] = '\0';
          local_c8.m_bcp47_language_tag[0x10] = '\0';
          local_c8.m_bcp47_language_tag[0x11] = '\0';
          local_c8.m_bcp47_language_tag[0x12] = '\0';
          local_c8.m_bcp47_language_tag[0x13] = '\0';
          local_c8.m_bcp47_language_tag[0x14] = '\0';
          local_c8.m_bcp47_language_tag[0x15] = '\0';
          local_c8.m_bcp47_language_tag[0x16] = '\0';
          local_c8.m_bcp47_language_tag[0x17] = '\0';
          local_c8.m_bcp47_language_tag[0x18] = '\0';
          local_c8.m_bcp47_language_tag[0x19] = '\0';
          local_c8.m_bcp47_language_tag[0x1a] = '\0';
          local_c8.m_bcp47_language_tag[0x1b] = '\0';
          local_c8.m_bcp47_language_tag[0x1c] = '\0';
          local_c8.m_bcp47_language_tag[0x1d] = '\0';
          local_c8.m_bcp47_language_tag[0x1e] = '\0';
          local_c8.m_bcp47_language_tag[0x1f] = '\0';
          local_c8.m_bcp47_language_tag[0] = '\0';
          local_c8.m_bcp47_language_tag[1] = '\0';
          local_c8.m_bcp47_language_tag[2] = '\0';
          local_c8.m_bcp47_language_tag[3] = '\0';
          local_c8.m_bcp47_language_tag[4] = '\0';
          local_c8.m_bcp47_language_tag[5] = '\0';
          local_c8.m_bcp47_language_tag[6] = '\0';
          local_c8.m_bcp47_language_tag[7] = '\0';
          local_c8.m_bcp47_language_tag[8] = '\0';
          local_c8.m_bcp47_language_tag[9] = '\0';
          local_c8.m_bcp47_language_tag[10] = '\0';
          local_c8.m_bcp47_language_tag[0xb] = '\0';
          local_c8.m_bcp47_language_tag[0xc] = '\0';
          local_c8.m_bcp47_language_tag[0xd] = '\0';
          local_c8.m_bcp47_language_tag[0xe] = '\0';
          local_c8.m_bcp47_language_tag[0xf] = '\0';
          local_c8.m_bcp47_language_tag[0x4d] = '\0';
          local_c8.m_bcp47_language_tag[0x4e] = '\0';
          local_c8.m_bcp47_language_tag[0x4f] = '\0';
          local_c8.m_bcp47_language_tag[0x50] = '\0';
          local_c8.m_bcp47_language_tag[0x51] = '\0';
          local_c8.m_bcp47_language_tag[0x52] = '\0';
          local_c8.m_bcp47_language_tag[0x53] = '\0';
          local_c8.m_bcp47_language_tag[0x54] = '\0';
          if (local_c8.m_language_subtag[8] == '\0') {
            lVar3 = 0x10;
            pcVar4 = (char *)0x0;
            do {
              cVar1 = local_c8.m_bcp47_language_tag[lVar3 + 0x45];
              local_c8.m_bcp47_language_tag[lVar3 + -0x10] = cVar1;
              if (cVar1 == '\0') {
                pcVar4 = local_c8.m_bcp47_language_tag + lVar3 + -0x10;
                break;
              }
              lVar3 = lVar3 + 1;
            } while (lVar3 != 0x65);
          }
          else {
            pcVar4 = (char *)0x0;
          }
          pcVar4 = LocaleStringBuilder('-',local_c8.m_script_subtag,5,pcVar4,
                                       local_c8.m_language_subtag);
          pcVar4 = LocaleStringBuilder('-',local_c8.m_region_subtag,5,pcVar4,
                                       local_c8.m_language_subtag);
          if (pcVar4 == (char *)0x0) {
            pcVar4 = "Unable to create m_bcp47_language_tag.";
            line_number = 0x3b0;
          }
          else {
            local_c8.m_numeric_locale = 0;
            local_c8.m_string_coll_map_locale = 0;
            pcVar4 = "ON_CRT_create_locale(LC_ALL, locale.m_bcp47_language_tag) failed.";
            line_number = 0x3b9;
          }
        }
      }
      else {
        pcVar4 = "ParseLocaleName() failed.";
        line_number = 0x399;
      }
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_locale.cpp"
                 ,line_number,"",pcVar4);
    }
    __src = &Ordinal;
  }
  memcpy(__return_storage_ptr__,__src,0xa0);
  return __return_storage_ptr__;
}

Assistant:

ON_Locale ON_Locale::FromWindowsLCIDAndName(
  ON__UINT32 windows_lcid,
  const char* name
  )
{
  if ( windows_lcid == ON_Locale::OrdinalLCID )
    return ON_Locale::Ordinal;

  if ( windows_lcid == ON_Locale::InvariantCultureLCID )
    return ON_Locale::InvariantCulture;

  if (0 == name || 0 == name[0])
  {
    return ON_Locale::InvariantCulture;
  }
  
  ON_Locale locale;

  locale.m_windows_lcid = windows_lcid;

  if (false == ON_Locale::ParseName(
    name,
    -1,
    locale.m_language_subtag, sizeof(locale.m_language_subtag) / sizeof(locale.m_language_subtag[0]),
    nullptr, 0,
    locale.m_script_subtag, sizeof(locale.m_script_subtag) / sizeof(locale.m_script_subtag[0]),
    locale.m_region_subtag, sizeof(locale.m_region_subtag) / sizeof(locale.m_region_subtag[0]),
    locale.m_windows_sortorder, sizeof(locale.m_windows_sortorder) / sizeof(locale.m_windows_sortorder[0])
    ))
  {
    ON_ERROR("ParseLocaleName() failed.");
    return ON_Locale::Ordinal;
  }

  if (0 == locale.m_language_subtag[0])
  {
    ON_ERROR("ParseLocaleName() returned empty language name.");
    return ON_Locale::Ordinal;
  }

  if (0 == locale.m_language_subtag[1])
  {
    ON_ERROR("ParseLocaleName() returned invalid language name.");
    return ON_Locale::Ordinal;
  }

  char* buffer_end = LocaleStringBuilderDestEnd(locale.m_bcp47_language_tag,sizeof(locale.m_bcp47_language_tag)/sizeof(locale.m_bcp47_language_tag[0]));
  char* s = locale.m_bcp47_language_tag;
  s = LocaleStringBuilder(ON_LOCALE_SUBTAG(0,locale.m_language_subtag),s,buffer_end);
  s = LocaleStringBuilder(ON_LOCALE_SUBTAG('-',locale.m_script_subtag),s,buffer_end);
  s = LocaleStringBuilder(ON_LOCALE_SUBTAG('-',locale.m_region_subtag),s,buffer_end);
  if (nullptr == s)
  {
    ON_ERROR("Unable to create m_bcp47_language_tag.");
    return ON_Locale::Ordinal;
  }
  
  locale.m_numeric_locale = ON_CRT_C_locale();

  locale.m_string_coll_map_locale = ON_CRT_create_locale_ALL( locale.m_bcp47_language_tag );
  if (0 == locale.m_string_coll_map_locale)
  {
    ON_ERROR("ON_CRT_create_locale(LC_ALL, locale.m_bcp47_language_tag) failed.");
    return ON_Locale::Ordinal;
  }

  return locale;
}